

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O2

Int64Vector * __thiscall
CoreML::Specification::OneHotEncoder::mutable_int64categories(OneHotEncoder *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (this->CategoryType_).stringcategories_;
  }
  else {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (StringVector *)operator_new(0x28);
    Int64Vector::Int64Vector((Int64Vector *)this_00);
    (this->CategoryType_).int64categories_ = (Int64Vector *)this_00;
  }
  return (Int64Vector *)this_00;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* OneHotEncoder::mutable_int64categories() {
  if (!has_int64categories()) {
    clear_CategoryType();
    set_has_int64categories();
    CategoryType_.int64categories_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.OneHotEncoder.int64Categories)
  return CategoryType_.int64categories_;
}